

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_cx_iface.c
# Opt level: O0

aom_codec_err_t ctrl_get_reference(aom_codec_alg_priv_t_conflict *ctx,__va_list_tag *args)

{
  uint uVar1;
  int *piVar2;
  YV12_BUFFER_CONFIG *yv12;
  uint *in_RSI;
  long in_RDI;
  YV12_BUFFER_CONFIG *fb;
  av1_ref_frame_t *frame;
  undefined8 *local_40;
  aom_codec_err_t local_4;
  
  if ((*(byte *)(*(long *)(*(long *)(in_RDI + 0xb50) + 0x160) + 0x42368) & 1) == 0) {
    uVar1 = *in_RSI;
    if (uVar1 < 0x29) {
      local_40 = (undefined8 *)((long)(int)uVar1 + *(long *)(in_RSI + 4));
      *in_RSI = uVar1 + 8;
    }
    else {
      local_40 = *(undefined8 **)(in_RSI + 2);
      *(undefined8 **)(in_RSI + 2) = local_40 + 1;
    }
    piVar2 = (int *)*local_40;
    if (piVar2 == (int *)0x0) {
      local_4 = AOM_CODEC_INVALID_PARAM;
    }
    else {
      yv12 = get_ref_frame((AV1_COMMON *)(*(long *)(*(long *)(in_RDI + 0xb50) + 0x160) + 0x3bf80),
                           *piVar2);
      if (yv12 == (YV12_BUFFER_CONFIG *)0x0) {
        local_4 = AOM_CODEC_ERROR;
      }
      else {
        yuvconfig2image((aom_image_t *)(piVar2 + 2),yv12,(void *)0x0);
        local_4 = AOM_CODEC_OK;
      }
    }
  }
  else {
    local_4 = AOM_CODEC_INCAPABLE;
  }
  return local_4;
}

Assistant:

static aom_codec_err_t ctrl_get_reference(aom_codec_alg_priv_t *ctx,
                                          va_list args) {
  if (ctx->ppi->cpi->oxcf.algo_cfg.skip_postproc_filtering)
    return AOM_CODEC_INCAPABLE;
  av1_ref_frame_t *const frame = va_arg(args, av1_ref_frame_t *);

  if (frame != NULL) {
    YV12_BUFFER_CONFIG *fb = get_ref_frame(&ctx->ppi->cpi->common, frame->idx);
    if (fb == NULL) return AOM_CODEC_ERROR;

    yuvconfig2image(&frame->img, fb, NULL);
    return AOM_CODEC_OK;
  } else {
    return AOM_CODEC_INVALID_PARAM;
  }
}